

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void pre_text_out(c2m_ctx_t c2m_ctx,token_t t)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  undefined1 uVar4;
  FILE *pFVar5;
  char *pcVar6;
  _func_void_macro_t_void_ptr *p_Var7;
  VARR_char_ptr_t *pVVar8;
  MIR_context_t pMVar9;
  pos_t pVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  pos_t *in_RAX;
  ulong uVar14;
  char *pcVar15;
  c2m_ctx_t __size;
  token_t *pptVar16;
  VARR_token_t *pVVar17;
  HTAB_macro_t *pHVar18;
  c2mir_options *pcVar19;
  void *pvVar20;
  size_t sVar21;
  int *piVar22;
  node_t_conflict n;
  uint uVar23;
  ulong uVar24;
  int extraout_EDX;
  c2m_ctx_t pcVar25;
  int iVar26;
  c2m_ctx_t pcVar27;
  token_t ptVar28;
  c2m_ctx_t format;
  c2m_ctx_t pcVar29;
  c2m_ctx_t __ptr;
  c2m_ctx_t pcVar30;
  code *pcVar31;
  code cVar32;
  byte bVar33;
  token_t __size_00;
  pos_t *ppVar34;
  VARR_char *pVVar35;
  _func_void_macro_t_void_ptr *p_Var36;
  pre_ctx *ppVar37;
  size_t sVar38;
  c2m_ctx_t pcVar39;
  bool bVar40;
  longdouble in_ST0;
  float fVar41;
  double dVar42;
  str_t sVar43;
  int iStack_124;
  int iStack_120;
  uint uStack_11c;
  _func_void_macro_t_void_ptr *p_Stack_118;
  int iStack_10c;
  tab_str_t tStack_f8;
  c2m_ctx_t pcStack_d8;
  VARR_char *pVStack_d0;
  pre_ctx *ppStack_c8;
  c2m_ctx_t pcStack_c0;
  c2m_ctx_t pcStack_b8;
  c2m_ctx_t pcStack_b0;
  c2m_ctx_t pcStack_a0;
  c2m_ctx_t pcStack_98;
  c2m_ctx_t pcStack_90;
  c2m_ctx_t pcStack_88;
  int iStack_7c;
  c2m_ctx_t pcStack_78;
  VARR_char *pVStack_70;
  token_t ptStack_68;
  pos_t *ppStack_60;
  pre_ctx *ppStack_58;
  FILE *pFStack_50;
  c2m_ctx_t pcStack_48;
  VARR_char *pVStack_40;
  pos_t *local_38;
  
  ppVar37 = c2m_ctx->pre_ctx;
  pFVar5 = (FILE *)c2m_ctx->options->prepro_output_file;
  if (((t == (token_t)0x0) && (ppVar37->pre_last_token != (token_t)0x0)) &&
     (*(short *)ppVar37->pre_last_token == 10)) {
    fputc(10,pFVar5);
    return;
  }
  if (*(short *)t == 10) goto LAB_001918a1;
  ppVar34 = &ppVar37->actual_pre_pos;
  pcVar15 = (ppVar37->actual_pre_pos).fname;
  pcVar6 = (t->pos).fname;
  local_38 = in_RAX;
  if (pcVar15 == pcVar6) {
    if ((ppVar37->actual_pre_pos).lno != (t->pos).lno) {
      if ((pcVar15 != pcVar6) ||
         (iVar26 = (ppVar37->actual_pre_pos).lno, iVar13 = (t->pos).lno,
         iVar26 + 4 < iVar13 || iVar13 <= iVar26)) goto LAB_00191755;
      iVar26 = (ppVar37->actual_pre_pos).lno;
      while (iVar26 != (t->pos).lno) {
        pVStack_40 = (VARR_char *)0x191908;
        fputc(10,pFVar5);
        iVar26 = (ppVar37->actual_pre_pos).lno + 1;
        (ppVar37->actual_pre_pos).lno = iVar26;
      }
      goto LAB_00191822;
    }
  }
  else {
LAB_00191755:
    if (ppVar37->pre_last_token != (token_t)0x0) {
      pVStack_40 = (VARR_char *)0x19176c;
      fputc(10,pFVar5);
    }
    pVStack_40 = (VARR_char *)0x191780;
    fprintf(pFVar5,"#line %d",(ulong)(uint)(t->pos).lno);
    pcVar15 = (t->pos).fname;
    if (ppVar34->fname != pcVar15) {
      ptVar28 = (token_t)c2m_ctx->temp_string;
      pVStack_40 = (VARR_char *)0x19179a;
      stringify(pcVar15,(VARR_char *)ptVar28);
      pVVar35 = c2m_ctx->temp_string;
      pcVar25 = (c2m_ctx_t)pVVar35->varr;
      if (pcVar25 == (c2m_ctx_t)0x0) {
        pVStack_40 = (VARR_char *)0x19191f;
        pre_text_out_cold_2();
      }
      else {
        uVar14 = pVVar35->els_num + 1;
        if (pVVar35->size < uVar14) {
          __size_00 = (token_t)((uVar14 >> 1) + uVar14);
          pVStack_40 = (VARR_char *)0x1917d0;
          ptVar28 = __size_00;
          local_38 = ppVar34;
          pcVar15 = (char *)realloc(pcVar25,(size_t)__size_00);
          pVVar35->varr = pcVar15;
          pVVar35->size = (size_t)__size_00;
          ppVar34 = local_38;
        }
        sVar38 = pVVar35->els_num;
        pVVar35->els_num = sVar38 + 1;
        pVVar35->varr[sVar38] = '\0';
        if (c2m_ctx->temp_string != (VARR_char *)0x0) {
          pVStack_40 = (VARR_char *)0x191815;
          fprintf(pFVar5," %s",c2m_ctx->temp_string->varr);
          goto LAB_00191815;
        }
      }
      pVStack_40 = (VARR_char *)pre_out;
      pre_text_out_cold_1();
      ptStack_68 = t;
      ppStack_60 = ppVar34;
      ppStack_58 = ppVar37;
      pFStack_50 = pFVar5;
      pcStack_48 = c2m_ctx;
      pVStack_40 = pVVar35;
      if (ptVar28 == (token_t)0x0) {
        ptVar28 = pcVar25->pre_ctx->pre_last_token;
        if (ptVar28 == (token_t)0x0) {
          pvVar20 = (void *)0xffffffffffffffff;
          pcVar15 = (char *)0x0;
        }
        else {
          pcVar15 = (ptVar28->pos).fname;
          pvVar20 = *(void **)&(ptVar28->pos).lno;
        }
        pcStack_88 = (c2m_ctx_t)0x1919aa;
        __size = (c2m_ctx_t)reg_malloc(pcVar25,0x30);
        *(htab_size_t *)&__size->ctx = 0x13d;
        ((pos_t *)&__size->options)->fname = pcVar15;
        __size->env[0].__jmpbuf[0] = (long)pvVar20;
        __size->env[0].__jmpbuf[3] = (long)"<EOF>";
        *(undefined4 *)(__size->env[0].__jmpbuf + 1) = 0;
        __size->env[0].__jmpbuf[2] = 0;
      }
      else {
        if ((*(short *)ptVar28 == -1) || (*(short *)ptVar28 == 0x147)) {
LAB_00191e9f:
          pcStack_88 = (c2m_ctx_t)0x191ebe;
          __assert_fail("t->code != T_EOU && t->code != EOF",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0xeda,"void pre_out(c2m_ctx_t, token_t)");
        }
        pcVar25->pre_ctx->pre_last_token = ptVar28;
        pcStack_88 = (c2m_ctx_t)0x191970;
        __size = (c2m_ctx_t)pptoken2token(pcVar25,ptVar28,1);
        if (__size == (c2m_ctx_t)0x0) {
          return;
        }
      }
      if (*(short *)&__size->ctx == 0x102) {
        pVVar17 = pcVar25->recorded_tokens;
        if (pVVar17 == (VARR_token_t *)0x0) goto LAB_00191ec3;
        sVar38 = pVVar17->els_num;
        if (sVar38 == 0) goto LAB_00191aa2;
        pptVar16 = pVVar17->varr;
        if (pptVar16 == (token_t *)0x0) goto LAB_00191ed2;
        if (*(short *)pptVar16[sVar38 - 1] != 0x102) goto LAB_00191aa2;
        pVVar17->els_num = sVar38 - 1;
        pVVar35 = pcVar25->temp_string;
        if ((pVVar35 != (VARR_char *)0x0) && (pVVar35->varr != (char *)0x0)) {
          pcVar39 = (c2m_ctx_t)pptVar16[sVar38 - 1];
          pVVar35->els_num = 0;
          p_Var7 = (_func_void_macro_t_void_ptr *)pcVar39->env[0].__jmpbuf[3];
          bVar33 = (byte)*p_Var7;
          if ((bVar33 == 0x4c) || (bVar33 == 0x55)) {
LAB_00191b21:
            p_Var36 = (_func_void_macro_t_void_ptr *)__size->env[0].__jmpbuf[3];
            bVar2 = (byte)*p_Var36;
            pcVar27 = (c2m_ctx_t)&DAT_00000001;
            if (bVar2 == 0x22) {
LAB_00191b33:
              bVar40 = false;
            }
            else {
              bVar40 = true;
              if (bVar2 == bVar33) {
                bVar40 = p_Var36[1] == (_func_void_macro_t_void_ptr)0x38;
              }
            }
          }
          else {
            if (bVar33 != 0x75) {
              pcVar27 = (c2m_ctx_t)0x0;
              goto LAB_00191b33;
            }
            if (p_Var7[1] != (_func_void_macro_t_void_ptr)0x38) goto LAB_00191b21;
            p_Var36 = (_func_void_macro_t_void_ptr *)__size->env[0].__jmpbuf[3];
            cVar1 = (char)*p_Var36;
            pcVar27 = (c2m_ctx_t)&DAT_00000002;
            if (cVar1 == '\"') goto LAB_00191b33;
            if (cVar1 == 'u') {
              bVar40 = p_Var36[1] != (_func_void_macro_t_void_ptr)0x38;
            }
            else {
              bVar40 = true;
            }
          }
          p_Var36 = (_func_void_macro_t_void_ptr *)__size->env[0].__jmpbuf[3];
          bVar2 = (byte)*p_Var36;
          format = (c2m_ctx_t)(ulong)bVar2;
          if ((bVar2 == 0x4c) || (bVar2 == 0x55)) {
LAB_00191b9e:
            pVVar35 = (VARR_char *)&DAT_00000001;
            if (bVar33 == 0x22) {
LAB_00191ba9:
              bVar40 = false;
            }
            else {
              bVar40 = true;
              if (bVar2 == bVar33) {
                bVar40 = p_Var7[1] == (_func_void_macro_t_void_ptr)0x38;
              }
            }
          }
          else {
            if (bVar2 == 0x75) {
              if (p_Var36[1] != (_func_void_macro_t_void_ptr)0x38) goto LAB_00191b9e;
              pVVar35 = (VARR_char *)&DAT_00000002;
              if (bVar33 != 0x22) {
                if (bVar33 == 0x75) {
                  bVar40 = p_Var7[1] != (_func_void_macro_t_void_ptr)0x38;
                }
                else {
                  bVar40 = true;
                }
                goto LAB_00191bbf;
              }
              goto LAB_00191ba9;
            }
            pVVar35 = (VARR_char *)0x0;
          }
LAB_00191bbf:
          if (bVar40) {
            format = (c2m_ctx_t)((pos_t *)&__size->options)->fname;
            pcStack_88 = (c2m_ctx_t)0x191bdc;
            error(pcVar25,0x1c2ca2,(char *)format,(void *)__size->env[0].__jmpbuf[0]);
          }
          p_Var7 = (_func_void_macro_t_void_ptr *)pcVar39->env[0].__jmpbuf[3];
          cVar1 = (char)*p_Var7;
          iStack_7c = 0x4c;
          if (cVar1 == 'L') {
LAB_00191bfe:
            bVar40 = false;
          }
          else {
            format = (c2m_ctx_t)__size->env[0].__jmpbuf[3];
            cVar3 = *(char *)&format->ctx;
            if (cVar3 == 'L') goto LAB_00191bfe;
            bVar40 = false;
            iStack_7c = 0x55;
            if ((cVar1 != 'U') && (cVar3 != 'U')) {
              if (((cVar1 == 'u') && (p_Var7[1] == (_func_void_macro_t_void_ptr)0x38)) ||
                 ((cVar3 == 'u' && (*(char *)((long)&format->ctx + 1) == '8')))) {
                format = (c2m_ctx_t)0x75;
                pcStack_88 = (c2m_ctx_t)0x191e64;
                VARR_charpush(pcVar25->temp_string,'u');
                iStack_7c = 0x38;
                goto LAB_00191bfe;
              }
              bVar40 = cVar1 != 'u' && cVar3 != 'u';
              iStack_7c = 0x75;
              if (cVar1 != 'u' && cVar3 != 'u') {
                iStack_7c = 0x20;
              }
            }
          }
          pVStack_70 = pVVar35;
          if (!bVar40) {
            ppVar37 = (pre_ctx *)pcVar25->temp_string;
            __ptr = (c2m_ctx_t)ppVar37->macro_tab;
            if (__ptr != (c2m_ctx_t)0x0) {
              pVVar17 = (VARR_token_t *)((long)&ppVar37->once_include_files->els_num + 1);
              if (ppVar37->temp_tokens < pVVar17) {
                pcVar30 = (c2m_ctx_t)((long)&pVVar17->els_num + ((ulong)pVVar17 >> 1));
                pcStack_88 = (c2m_ctx_t)0x191c3b;
                format = pcVar30;
                pHVar18 = (HTAB_macro_t *)realloc(__ptr,(size_t)pcVar30);
                ppVar37->macro_tab = pHVar18;
                ppVar37->temp_tokens = (VARR_token_t *)pcVar30;
              }
              pVVar8 = ppVar37->once_include_files;
              ppVar37->once_include_files = (VARR_char_ptr_t *)((long)&pVVar8->els_num + 1);
              *(char *)((long)&ppVar37->macro_tab->els_num + (long)pVVar8) = (char)iStack_7c;
              goto LAB_00191c5a;
            }
LAB_00191f1f:
            pcStack_88 = (c2m_ctx_t)stringify;
            pre_out_cold_1();
            pcVar29 = format;
            pcVar30 = __ptr;
            pcStack_a0 = pcVar25;
            pcStack_98 = pcVar39;
            pcStack_90 = __size;
            pcStack_88 = pcVar27;
            if ((format != (c2m_ctx_t)0x0) &&
               (pcVar30 = (c2m_ctx_t)format->env[0].__jmpbuf[0], pcVar25 = format, pcVar39 = __ptr,
               pcVar30 != (c2m_ctx_t)0x0)) {
              format->ctx = (MIR_context_t)0x0;
              if (((pos_t *)&format->options)->fname == (char *)0x0) {
                pcVar29 = (c2m_ctx_t)&DAT_00000001;
                pcStack_b0 = (c2m_ctx_t)0x191f5f;
                pvVar20 = realloc(pcVar30,1);
                format->env[0].__jmpbuf[0] = (long)pvVar20;
                ((pos_t *)&format->options)->fname = (char *)0x1;
              }
              pMVar9 = format->ctx;
              format->ctx = (MIR_context_t)((long)&pMVar9->gen_ctx + 1);
              *(undefined1 *)((long)format->env[0].__jmpbuf[0] + (long)pMVar9) = 0x22;
              while( true ) {
                cVar1 = *(char *)&__ptr->ctx;
                pcVar39 = __ptr;
                if ((cVar1 == '\"') || (cVar1 == '\\')) {
                  pcVar30 = (c2m_ctx_t)format->env[0].__jmpbuf[0];
                  if (pcVar30 == (c2m_ctx_t)0x0) goto LAB_00192077;
                  pcVar15 = (char *)((long)&format->ctx->gen_ctx + 1);
                  if (((pos_t *)&format->options)->fname < pcVar15) {
                    __size = (c2m_ctx_t)(pcVar15 + ((ulong)pcVar15 >> 1));
                    pcStack_b0 = (c2m_ctx_t)0x191fbe;
                    pcVar29 = __size;
                    pvVar20 = realloc(pcVar30,(size_t)__size);
                    format->env[0].__jmpbuf[0] = (long)pvVar20;
                    ((pos_t *)&format->options)->fname = (char *)__size;
                  }
                  pMVar9 = format->ctx;
                  format->ctx = (MIR_context_t)((long)&pMVar9->gen_ctx + 1);
                  *(undefined1 *)((long)format->env[0].__jmpbuf[0] + (long)pMVar9) = 0x5c;
                }
                else if (cVar1 == '\0') {
                  pcVar30 = (c2m_ctx_t)format->env[0].__jmpbuf[0];
                  if (pcVar30 != (c2m_ctx_t)0x0) {
                    pcVar15 = (char *)((long)&format->ctx->gen_ctx + 1);
                    if (((pos_t *)&format->options)->fname < pcVar15) {
                      pcStack_b0 = (c2m_ctx_t)0x19204d;
                      pvVar20 = realloc(pcVar30,(size_t)(pcVar15 + ((ulong)pcVar15 >> 1)));
                      format->env[0].__jmpbuf[0] = (long)pvVar20;
                      ((pos_t *)&format->options)->fname = pcVar15 + ((ulong)pcVar15 >> 1);
                    }
                    pMVar9 = format->ctx;
                    format->ctx = (MIR_context_t)((long)&pMVar9->gen_ctx + 1);
                    *(undefined1 *)((long)format->env[0].__jmpbuf[0] + (long)pMVar9) = 0x22;
                    return;
                  }
                  goto LAB_00192081;
                }
                pcVar30 = (c2m_ctx_t)format->env[0].__jmpbuf[0];
                if (pcVar30 == (c2m_ctx_t)0x0) break;
                uVar4 = *(undefined1 *)&__ptr->ctx;
                pcVar27 = (c2m_ctx_t)CONCAT71((int7)((ulong)pcVar27 >> 8),uVar4);
                pcVar15 = (char *)((long)&format->ctx->gen_ctx + 1);
                if (((pos_t *)&format->options)->fname < pcVar15) {
                  __size = (c2m_ctx_t)(pcVar15 + ((ulong)pcVar15 >> 1));
                  pcStack_b0 = (c2m_ctx_t)0x192005;
                  pcVar29 = __size;
                  pvVar20 = realloc(pcVar30,(size_t)__size);
                  format->env[0].__jmpbuf[0] = (long)pvVar20;
                  ((pos_t *)&format->options)->fname = (char *)__size;
                }
                pMVar9 = format->ctx;
                format->ctx = (MIR_context_t)((long)&pMVar9->gen_ctx + 1);
                *(undefined1 *)((long)format->env[0].__jmpbuf[0] + (long)pMVar9) = uVar4;
                __ptr = (c2m_ctx_t)((long)&__ptr->ctx + 1);
              }
              pcStack_b0 = (c2m_ctx_t)0x192077;
              stringify_cold_3();
LAB_00192077:
              pcStack_b0 = (c2m_ctx_t)0x19207c;
              stringify_cold_1();
            }
            pcStack_b0 = (c2m_ctx_t)0x192081;
            stringify_cold_4();
LAB_00192081:
            pcStack_b0 = (c2m_ctx_t)pptoken2token;
            stringify_cold_2();
            uVar23 = (*(uint *)&pcVar29->ctx & 0xffff) - 0x13d;
            pcStack_d8 = pcVar25;
            pVStack_d0 = pVVar35;
            ppStack_c8 = ppVar37;
            pcStack_c0 = pcVar39;
            pcStack_b8 = __size;
            pcStack_b0 = pcVar27;
            if (uVar23 < 0xb) {
              if (uVar23 == 2) {
                *(uint *)&pcVar29->ctx = *(uint *)&pcVar29->ctx & 0xffff0103;
              }
              else if ((0x7f3U >> (uVar23 & 0x1f) & 1) != 0) {
                __assert_fail("t->code != T_HEADER && t->code != T_BOA && t->code != T_EOA && t->code != T_EOR && t->code != T_EOP && t->code != T_EOFILE && t->code != T_EOU && t->code != T_PLM && t->code != T_RDBLNO"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x732,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
              }
            }
            iVar26 = *(htab_size_t *)&pcVar29->ctx << 0x10;
            if (extraout_EDX != 0 && iVar26 == 0x1030000) {
              p_Var7 = (_func_void_macro_t_void_ptr *)pcVar29->env[0].__jmpbuf[3];
              sVar21 = strlen((char *)p_Var7);
              str_add(&tStack_f8,pcVar30,(char *)p_Var7,sVar21 + 1,0x102,0,0);
              if (tStack_f8.key == 0x102) {
                return;
              }
              *(short *)&pcVar29->ctx = (short)tStack_f8.key;
              *(undefined4 *)(pcVar29->env[0].__jmpbuf + 1) = 0;
              pcVar29->env[0].__jmpbuf[2] = 0;
              return;
            }
            if (iVar26 == 0xa0000) {
              return;
            }
            if (iVar26 == 0x200000) {
              return;
            }
            if (iVar26 != 0x1000000) {
              return;
            }
            p_Var7 = (_func_void_macro_t_void_ptr *)pcVar29->env[0].__jmpbuf[3];
            sVar21 = strlen((char *)p_Var7);
            iVar26 = (int)sVar21;
            if (iVar26 < 1) {
              __assert_fail("last >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x746,"token_t pptoken2token(c2m_ctx_t, token_t, int)");
            }
            p_Stack_118 = p_Var7;
            if (*p_Var7 == (_func_void_macro_t_void_ptr)0x30) {
              if (((byte)p_Var7[1] | 0x20) == 0x78) {
                iStack_10c = 0x10;
                bVar40 = true;
                bVar33 = 0;
              }
              else {
                bVar33 = 1;
                if (((byte)p_Var7[1] | 0x20) != 0x62) {
                  iStack_10c = 8;
                  goto LAB_001921b0;
                }
                pcVar31 = error;
                if (pcVar30->options->pedantic_p == 0) {
                  pcVar31 = warning;
                }
                bVar40 = false;
                (*pcVar31)(pcVar30,((pos_t *)&pcVar29->options)->fname,
                           (void *)pcVar29->env[0].__jmpbuf[0],"binary number is not a standard: %s"
                           ,p_Var7);
                iStack_10c = 2;
                p_Stack_118 = p_Var7 + 2;
              }
            }
            else {
              iStack_10c = 10;
LAB_001921b0:
              bVar33 = 1;
              bVar40 = false;
            }
            uStack_11c = iVar26 - 1;
            uVar14 = 1;
            if (1 < iVar26) {
              uVar14 = sVar21 & 0xffffffff;
            }
            uVar24 = 0;
            bVar12 = false;
            do {
              bVar2 = (byte)p_Var7[uVar24];
              if (bVar2 < 0x65) {
                bVar11 = true;
                if ((bVar2 != 0x2e) && (bVar11 = true, bVar2 != 0x50)) {
LAB_00192203:
                  bVar11 = bVar12;
                  if ((bool)(bVar33 & bVar2 == 0x45)) {
LAB_00192212:
                    bVar11 = true;
                  }
                }
              }
              else if (bVar2 == 0x65) {
                bVar11 = bVar12;
                if (!bVar40) goto LAB_00192212;
              }
              else {
                bVar11 = true;
                if (bVar2 != 0x70) goto LAB_00192203;
              }
              uVar24 = uVar24 + 1;
              bVar12 = bVar11;
            } while (uVar14 != uVar24);
            if (iVar26 < 3) {
LAB_00192320:
              if (iVar26 == 1) {
LAB_0019232a:
                p_Var36 = p_Var7 + uStack_11c;
                iVar13 = strcmp((char *)p_Var36,"L");
                if ((iVar13 == 0) || (iVar13 = strcmp((char *)p_Var36,"l"), iVar13 == 0)) {
                  uStack_11c = iVar26 - 2;
                  iStack_124 = 1;
                  bVar12 = false;
                  bVar2 = 0;
                  iStack_120 = 0;
                  bVar40 = false;
                }
                else {
                  iVar13 = strcmp((char *)p_Var36,"U");
                  if ((iVar13 == 0) || (iVar13 = strcmp((char *)p_Var36,"u"), iVar13 == 0)) {
                    bVar12 = false;
                    iStack_120 = 1;
                    bVar2 = 1;
LAB_00192632:
                    uStack_11c = iVar26 - 2;
                  }
                  else {
                    if (bVar11) {
                      iVar13 = strcmp((char *)p_Var36,"F");
                      if ((iVar13 == 0) || (iVar13 = strcmp((char *)p_Var36,"f"), iVar13 == 0)) {
                        bVar11 = false;
                        bVar12 = true;
                        bVar2 = 0;
                        iStack_120 = 0;
                        goto LAB_00192632;
                      }
                      bVar11 = true;
                    }
                    else {
                      bVar11 = false;
                    }
                    bVar12 = false;
                    bVar2 = 0;
                    iStack_120 = 0;
                  }
                  bVar40 = true;
                  iStack_124 = 0;
                }
              }
              else {
                p_Var36 = p_Var7 + (iVar26 - 2);
                iVar13 = strcmp((char *)p_Var36,"LL");
                if ((iVar13 == 0) || (iVar13 = strcmp((char *)p_Var36,"ll"), iVar13 == 0)) {
                  uStack_11c = iVar26 - 3;
                  iVar26 = 1;
                  bVar40 = true;
                  bVar12 = false;
                  bVar2 = 0;
                  iStack_120 = 0;
                  iStack_124 = 0;
                  bVar33 = 1;
                  goto LAB_00192678;
                }
                iVar13 = strcmp((char *)p_Var36,"LU");
                if ((((iVar13 != 0) && (iVar13 = strcmp((char *)p_Var36,"UL"), iVar13 != 0)) &&
                    (iVar13 = strcmp((char *)p_Var36,"lu"), iVar13 != 0)) &&
                   (((iVar13 = strcmp((char *)p_Var36,"ul"), iVar13 != 0 &&
                     (iVar13 = strcmp((char *)p_Var36,"Lu"), iVar13 != 0)) &&
                    ((iVar13 = strcmp((char *)p_Var36,"uL"), iVar13 != 0 &&
                     ((iVar13 = strcmp((char *)p_Var36,"lU"), iVar13 != 0 &&
                      (iVar13 = strcmp((char *)p_Var36,"Ul"), iVar13 != 0)))))))) goto LAB_0019232a;
                uStack_11c = iVar26 - 3;
                bVar12 = false;
                iStack_120 = 1;
                bVar2 = 1;
                bVar40 = false;
                iStack_124 = 1;
              }
              bVar33 = 0;
              iVar26 = 0;
            }
            else {
              p_Var36 = p_Var7 + (iVar26 - 3);
              iVar13 = strcmp((char *)p_Var36,"LLU");
              if (((((iVar13 != 0) && (iVar13 = strcmp((char *)p_Var36,"ULL"), iVar13 != 0)) &&
                   (iVar13 = strcmp((char *)p_Var36,"llu"), iVar13 != 0)) &&
                  ((iVar13 = strcmp((char *)p_Var36,"ull"), iVar13 != 0 &&
                   (iVar13 = strcmp((char *)p_Var36,"LLu"), iVar13 != 0)))) &&
                 ((iVar13 = strcmp((char *)p_Var36,"uLL"), iVar13 != 0 &&
                  ((iVar13 = strcmp((char *)p_Var36,"llU"), iVar13 != 0 &&
                   (iVar13 = strcmp((char *)p_Var36,"Ull"), iVar13 != 0)))))) goto LAB_00192320;
              uStack_11c = iVar26 - 4;
              bVar12 = false;
              iStack_120 = 1;
              bVar2 = 1;
              bVar40 = true;
              iStack_124 = 0;
              bVar33 = 1;
              iVar26 = 1;
            }
LAB_00192678:
            if (bVar11) {
              if ((bool)(bVar2 | bVar33)) {
                bVar40 = false;
                error(pcVar30,0x1c2e28,((pos_t *)&pcVar29->options)->fname,
                      (void *)pcVar29->env[0].__jmpbuf[0],p_Var7);
                bVar33 = 1;
              }
              else {
                if (!bVar40) {
                  bVar40 = true;
                  bVar33 = 0;
                  bVar11 = false;
                  bVar2 = 1;
                  goto LAB_001926d1;
                }
                bVar33 = 1;
                bVar40 = false;
              }
            }
            else {
              bVar40 = true;
              bVar33 = 0;
            }
            bVar11 = true;
            bVar2 = 0;
LAB_001926d1:
            piVar22 = __errno_location();
            *piVar22 = 0;
            if (bVar12) {
              fVar41 = strtof((char *)p_Stack_118,(char **)&tStack_f8);
              pVar10 = *(pos_t *)&pcVar29->options;
              n = new_node(pcVar30,N_F);
              add_pos(pcVar30,n,pVar10);
              (n->u).f = fVar41;
            }
            else if (bVar40) {
              if (bVar11) {
                n = get_int_node_from_repr
                              (pcVar30,(char *)p_Stack_118,(char **)&tStack_f8,iStack_10c,iStack_120
                               ,iStack_124,iVar26,*(pos_t *)&pcVar29->options);
              }
              else {
                strtold((char *)p_Stack_118,(char **)&tStack_f8);
                n = new_ld_node(pcVar30,in_ST0,*(pos_t *)&pcVar29->options);
              }
            }
            else {
              dVar42 = strtod((char *)p_Stack_118,(char **)&tStack_f8);
              pVar10 = *(pos_t *)&pcVar29->options;
              n = new_node(pcVar30,N_D);
              add_pos(pcVar30,n,pVar10);
              (n->u).d = dVar42;
            }
            pcVar29->env[0].__jmpbuf[2] = (long)n;
            if ((_func_void_macro_t_void_ptr *)tStack_f8.str.s == p_Var7 + (long)(int)uStack_11c + 1
               ) {
              if (*piVar22 != 0) {
                if ((bool)(bVar12 | bVar33 | bVar2)) {
                  warning(pcVar30,0x1c2e43,((pos_t *)&pcVar29->options)->fname,
                          (void *)pcVar29->env[0].__jmpbuf[0],
                          (_func_void_macro_t_void_ptr *)pcVar29->env[0].__jmpbuf[3]);
                }
                else {
                  pcVar31 = error;
                  if (pcVar30->options->pedantic_p == 0) {
                    pcVar31 = warning;
                  }
                  (*pcVar31)(pcVar30,((pos_t *)&pcVar29->options)->fname,
                             (void *)pcVar29->env[0].__jmpbuf[0],"number %s is out of range",
                             (_func_void_macro_t_void_ptr *)pcVar29->env[0].__jmpbuf[3]);
                }
              }
            }
            else {
              pFVar5 = (FILE *)pcVar30->options->message_file;
              if (pFVar5 != (FILE *)0x0) {
                fprintf(pFVar5,"%s:%s:%s\n",p_Var7);
              }
              error(pcVar30,0x1c2e28,((pos_t *)&pcVar29->options)->fname,
                    (void *)pcVar29->env[0].__jmpbuf[0],
                    (_func_void_macro_t_void_ptr *)pcVar29->env[0].__jmpbuf[3]);
            }
            return;
          }
LAB_00191c5a:
          p_Var7 = (_func_void_macro_t_void_ptr *)pcVar39->env[0].__jmpbuf[3];
          cVar1 = (char)p_Var7[(long)pcVar27];
          ppVar37 = (pre_ctx *)CONCAT71((int7)((ulong)ppVar37 >> 8),cVar1);
          pcStack_78 = pcVar39;
          if (cVar1 != '\0') {
            pcVar15 = (undefined1 *)((long)&pcVar27->ctx + 1) + (long)p_Var7;
            do {
              pcVar39 = (c2m_ctx_t)pcVar25->temp_string;
              pvVar20 = (void *)pcVar39->env[0].__jmpbuf[0];
              if (pvVar20 == (void *)0x0) {
                pcStack_88 = (c2m_ctx_t)0x191e9a;
                pre_out_cold_2();
                goto LAB_00191e9a;
              }
              pcVar19 = (c2mir_options *)((long)&pcVar39->ctx->gen_ctx + 1);
              if (pcVar39->options < pcVar19) {
                pcVar27 = (c2m_ctx_t)((long)&pcVar19->message_file + ((ulong)pcVar19 >> 1));
                pcStack_88 = (c2m_ctx_t)0x191ca2;
                format = pcVar27;
                pvVar20 = realloc(pvVar20,(size_t)pcVar27);
                pcVar39->env[0].__jmpbuf[0] = (long)pvVar20;
                pcVar39->options = (c2mir_options *)pcVar27;
              }
              pMVar9 = pcVar39->ctx;
              pcVar39->ctx = (MIR_context_t)((long)&pMVar9->gen_ctx + 1);
              *(char *)((long)pcVar39->env[0].__jmpbuf[0] + (long)pMVar9) = (char)ppVar37;
              cVar1 = *pcVar15;
              ppVar37 = (pre_ctx *)CONCAT71((int7)((ulong)ppVar37 >> 8),cVar1);
              pcVar15 = pcVar15 + 1;
            } while (cVar1 != '\0');
          }
          pcVar27 = pcStack_78;
          pVVar35 = pcVar25->temp_string;
          if (((pVVar35 == (VARR_char *)0x0) || (pVVar35->varr == (char *)0x0)) ||
             (sVar38 = pVVar35->els_num, sVar38 == 0)) goto LAB_00191ec8;
          if (pVVar35->varr[sVar38 - 1] != '\"') goto LAB_00191edc;
          pVVar35->els_num = sVar38 - 1;
          p_Var7 = (_func_void_macro_t_void_ptr *)__size->env[0].__jmpbuf[3];
          cVar32 = (p_Var7 + 1)[(long)pVStack_70];
          if (cVar32 != (code)0x0) {
            ppVar37 = (pre_ctx *)((undefined1 *)((long)&pVStack_70->els_num + 2) + (long)p_Var7);
            do {
              pcVar39 = (c2m_ctx_t)pcVar25->temp_string;
              pvVar20 = (void *)pcVar39->env[0].__jmpbuf[0];
              if (pvVar20 == (void *)0x0) goto LAB_00191e9a;
              pcVar19 = (c2mir_options *)((long)&pcVar39->ctx->gen_ctx + 1);
              if (pcVar39->options < pcVar19) {
                __size = (c2m_ctx_t)((long)&pcVar19->message_file + ((ulong)pcVar19 >> 1));
                pcStack_88 = (c2m_ctx_t)0x191d50;
                format = __size;
                pvVar20 = realloc(pvVar20,(size_t)__size);
                pcVar39->env[0].__jmpbuf[0] = (long)pvVar20;
                pcVar39->options = (c2mir_options *)__size;
              }
              pMVar9 = pcVar39->ctx;
              pcVar39->ctx = (MIR_context_t)((long)&pMVar9->gen_ctx + 1);
              *(code *)((long)pcVar39->env[0].__jmpbuf[0] + (long)pMVar9) = cVar32;
              cVar32 = *(code *)&ppVar37->once_include_files;
              ppVar37 = (pre_ctx *)((long)&ppVar37->once_include_files + 1);
            } while (cVar32 != (code)0x0);
          }
          pVVar35 = pcVar25->temp_string;
          if (((pVVar35 != (VARR_char *)0x0) &&
              (__ptr = (c2m_ctx_t)pVVar35->varr, __ptr != (c2m_ctx_t)0x0)) &&
             (sVar38 = pVVar35->els_num, sVar38 != 0)) {
            if (*(char *)((long)__ptr->env[0].__jmpbuf + (sVar38 - 0x11)) != '\"') {
              pcStack_88 = (c2m_ctx_t)0x191f1a;
              __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0xf07,"void pre_out(c2m_ctx_t, token_t)");
            }
            uVar14 = sVar38 + 1;
            if (pVVar35->size < uVar14) {
              __size = (c2m_ctx_t)((uVar14 >> 1) + uVar14);
              pcStack_88 = (c2m_ctx_t)0x191dc7;
              format = __size;
              pcVar15 = (char *)realloc(__ptr,(size_t)__size);
              pVVar35->varr = pcVar15;
              pVVar35->size = (size_t)__size;
            }
            sVar38 = pVVar35->els_num;
            pVVar35->els_num = sVar38 + 1;
            pVVar35->varr[sVar38] = '\0';
            if (pcVar25->temp_string != (VARR_char *)0x0) {
              pcStack_88 = (c2m_ctx_t)0x191e02;
              sVar43 = uniq_cstr(pcVar25,pcVar25->temp_string->varr);
              pcVar27->env[0].__jmpbuf[3] = (long)sVar43.s;
              pcStack_88 = (c2m_ctx_t)0x191e1c;
              set_string_val(pcVar25,(token_t)pcVar27,pcVar25->temp_string,iStack_7c);
              __size = pcVar27;
              goto LAB_00191aa2;
            }
            pcStack_88 = (c2m_ctx_t)0x191f1f;
            pre_out_cold_4();
            goto LAB_00191f1f;
          }
          goto LAB_00191ecd;
        }
      }
      else {
LAB_00191aa2:
        pVVar17 = pcVar25->recorded_tokens;
        if (pVVar17->varr != (token_t *)0x0) {
          uVar14 = pVVar17->els_num + 1;
          if (pVVar17->size < uVar14) {
            sVar38 = (uVar14 >> 1) + uVar14;
            pcStack_88 = (c2m_ctx_t)0x191ad8;
            pptVar16 = (token_t *)realloc(pVVar17->varr,sVar38 * 8);
            pVVar17->varr = pptVar16;
            pVVar17->size = sVar38;
          }
          sVar38 = pVVar17->els_num;
          pVVar17->els_num = sVar38 + 1;
          pVVar17->varr[sVar38] = (token_t)__size;
          return;
        }
        pcStack_88 = (c2m_ctx_t)0x191ec3;
        pre_out_cold_9();
LAB_00191ec3:
        pcStack_88 = (c2m_ctx_t)0x191ec8;
        pre_out_cold_10();
LAB_00191ec8:
        pcStack_88 = (c2m_ctx_t)0x191ecd;
        pre_out_cold_6();
LAB_00191ecd:
        pcStack_88 = (c2m_ctx_t)0x191ed2;
        pre_out_cold_5();
LAB_00191ed2:
        pcStack_88 = (c2m_ctx_t)0x191ed7;
        pre_out_cold_8();
      }
      pcStack_88 = (c2m_ctx_t)0x191edc;
      pre_out_cold_7();
LAB_00191edc:
      pcStack_88 = (c2m_ctx_t)0x191efb;
      __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0xf03,"void pre_out(c2m_ctx_t, token_t)");
    }
LAB_00191815:
    pVStack_40 = (VARR_char *)0x191822;
    fputc(10,pFVar5);
LAB_00191822:
    if (1 < (t->pos).ln_pos) {
      iVar26 = 0;
      do {
        pVStack_40 = (VARR_char *)0x19183b;
        fputc(0x20,pFVar5);
        iVar26 = iVar26 + 1;
      } while (iVar26 < (t->pos).ln_pos + -1);
    }
    iVar26 = (t->pos).lno;
    iVar13 = (t->pos).ln_pos;
    ppVar34->fname = (t->pos).fname;
    ppVar34->lno = iVar26;
    ppVar34->ln_pos = iVar13;
  }
  if (*(short *)t == 0x20) {
    pcVar15 = " ";
  }
  else {
    pcVar15 = t->repr;
  }
  pVStack_40 = (VARR_char *)0x1918a1;
  fputs(pcVar15,pFVar5);
LAB_001918a1:
  ppVar37->pre_last_token = t;
  return;
LAB_00191e9a:
  pcStack_88 = (c2m_ctx_t)0x191e9f;
  pre_out_cold_3();
  goto LAB_00191e9f;
}

Assistant:

static void pre_text_out (c2m_ctx_t c2m_ctx, token_t t) { /* NULL means end of output */
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  int i;
  FILE *f = c2m_options->prepro_output_file;

  if (t == NULL && pre_last_token != NULL && pre_last_token->code == '\n') {
    fprintf (f, "\n");
    return;
  }
  if (t->code == '\n') {
    pre_last_token = t;
    return;
  }
  if (actual_pre_pos.fname != t->pos.fname || actual_pre_pos.lno != t->pos.lno) {
    if (actual_pre_pos.fname == t->pos.fname && actual_pre_pos.lno < t->pos.lno
        && actual_pre_pos.lno + 4 >= t->pos.lno) {
      for (; actual_pre_pos.lno != t->pos.lno; actual_pre_pos.lno++) fprintf (f, "\n");
    } else {
      if (pre_last_token != NULL) fprintf (f, "\n");
      fprintf (f, "#line %d", t->pos.lno);
      if (actual_pre_pos.fname != t->pos.fname) {
        stringify (t->pos.fname, temp_string);
        VARR_PUSH (char, temp_string, '\0');
        fprintf (f, " %s", VARR_ADDR (char, temp_string));
      }
      fprintf (f, "\n");
    }
    for (i = 0; i < t->pos.ln_pos - 1; i++) fprintf (f, " ");
    actual_pre_pos = t->pos;
  }
  fprintf (f, "%s", t->code == ' ' ? " " : t->repr);
  pre_last_token = t;
}